

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O0

void dlib::
     matrix_assign_big<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_exp<dlib::matrix_op<dlib::op_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               *src)

{
  matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_exp<dlib::matrix_op<dlib::op_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>
            (dest,src);
  return;
}

Assistant:

void matrix_assign_big (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    {
        matrix_assign_default(dest,src);
    }